

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImDrawList::AddPolyline<nivalis::point>
          (ImDrawList *this,point *points,int points_count,ImU32 col,bool closed,float thickness)

{
  uint uVar1;
  uint uVar2;
  ImDrawCmd *pIVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ImVec2 IVar7;
  float *pfVar8;
  uint *puVar9;
  bool bVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  float **ppfVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  ulong uVar21;
  ImDrawVert *pIVar22;
  uint *puVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  int iVar28;
  ulong uVar29;
  bool bVar30;
  bool bVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float in_XMM6_Da;
  float in_XMM6_Db;
  float in_XMM6_Dc;
  float in_XMM6_Dd;
  float fVar44;
  float fVar45;
  float d2;
  float fVar46;
  float in_XMM12_Da;
  float fVar47;
  float in_XMM12_Db;
  float fVar48;
  int local_18c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  
  if (1 < points_count) {
    IVar7 = this->_Data->TexUvWhitePixel;
    uVar19 = points_count - 1;
    uVar14 = (ulong)uVar19;
    if (closed) {
      uVar14 = (ulong)(uint)points_count;
    }
    uVar4 = this->Flags;
    uVar27 = col & 0xffffff;
    uVar29 = (ulong)(uint)points_count;
    iVar28 = (int)uVar14;
    if (1.0 < thickness || (uVar4 & 1) == 0) {
      iVar20 = (uVar4 & 1) * 3 + 3;
      iVar15 = 9;
      if ((uVar4 & 1) != 0) {
        iVar15 = 0x1b;
        thickness = thickness + -1.0;
      }
      PrimReserve(this,iVar15 * iVar28,points_count * iVar20);
      fVar36 = thickness * 0.5;
      fVar33 = fVar36 + 1.0;
      fVar41 = 0.0;
      if (closed) {
        in_XMM12_Da = *points->x - *points[uVar29 - 1].x;
        in_XMM12_Db = *points->y - *points[uVar29 - 1].y;
        fVar41 = in_XMM12_Da * in_XMM12_Da + in_XMM12_Db * in_XMM12_Db;
        if (0.0 < fVar41) {
          in_XMM12_Da = in_XMM12_Da * (1.0 / SQRT(fVar41));
          in_XMM12_Db = in_XMM12_Db * (1.0 / SQRT(fVar41));
        }
      }
      uVar5 = this->_VtxCurrentIdx;
      uVar1 = (uVar4 & 1) * 2 + 2;
      ppfVar16 = &points->y;
      iVar28 = 0;
      local_18c = 0;
      uVar17 = 0;
      do {
        uVar21 = uVar17 + 1;
        uVar18 = 0;
        if (uVar29 - 1 != uVar17) {
          uVar18 = uVar21 & 0xffffffff;
        }
        fVar34 = *ppfVar16[-1];
        fVar35 = **ppfVar16;
        fVar42 = fVar34 - *points[uVar18].x;
        fVar43 = fVar35 - *points[uVar18].y;
        fVar46 = fVar42 * fVar42 + fVar43 * fVar43;
        if (0.0 < fVar46) {
          fVar42 = fVar42 * (1.0 / SQRT(fVar46));
          fVar43 = fVar43 * (1.0 / SQRT(fVar46));
        }
        if (uVar17 == 0 && !closed) {
          in_XMM12_Da = -fVar42;
          in_XMM12_Db = -fVar43;
          fVar37 = fVar46;
        }
        else {
          fVar37 = fVar41;
          if (uVar19 == uVar17 && !closed) {
            fVar42 = -in_XMM12_Da;
            fVar43 = -in_XMM12_Db;
            fVar46 = fVar41;
          }
        }
        fVar41 = fVar46;
        fVar46 = -in_XMM12_Db;
        fVar44 = in_XMM12_Da * fVar43 - fVar42 * in_XMM12_Db;
        fVar45 = in_XMM12_Da * fVar42 + fVar43 * in_XMM12_Db;
        if (ABS(fVar44) <= 1e-05) {
          fVar37 = fVar46 * fVar36 + fVar34;
          fVar32 = in_XMM12_Da * fVar36 + fVar35;
          fVar48 = in_XMM12_Db * fVar36 + fVar34;
          fVar47 = -in_XMM12_Da * fVar36 + fVar35;
          if ((uVar4 & 1) != 0) {
            local_128 = fVar46 * fVar33 + fVar34;
            fStack_124 = in_XMM12_Da * fVar33 + fVar35;
            fStack_120 = in_XMM12_Db * fVar33 + fVar34;
            fStack_11c = -in_XMM12_Da * fVar33 + fVar35;
          }
        }
        else {
          fVar47 = fVar36 / fVar44;
          if (1e-05 < fVar45) {
            fVar32 = fVar41;
            if (fVar37 <= fVar41) {
              fVar32 = fVar37;
            }
            fVar37 = ((fVar42 + in_XMM12_Da) * (fVar42 + in_XMM12_Da) +
                     (fVar43 + in_XMM12_Db) * (fVar43 + in_XMM12_Db)) * fVar47 * fVar47;
            if (fVar32 < fVar37) {
              fVar32 = fVar32 / fVar37;
              if (fVar32 < 0.0) {
                fVar32 = sqrtf(fVar32);
              }
              else {
                fVar32 = SQRT(fVar32);
              }
              fVar47 = fVar47 * fVar32;
              fVar35 = **ppfVar16;
              fVar34 = *ppfVar16[-1];
            }
          }
          fVar40 = fVar43 + in_XMM12_Db;
          fVar39 = fVar42 + in_XMM12_Da;
          fVar37 = fVar47 * fVar39 + fVar34;
          fVar32 = fVar47 * fVar40 + fVar35;
          fVar48 = fVar47 * -fVar39 + fVar34;
          fVar47 = fVar47 * -fVar40 + fVar35;
          if ((uVar4 & 1) != 0) {
            fVar38 = fVar33 / fVar44;
            local_128 = fVar39 * fVar38 + fVar34;
            fStack_124 = fVar40 * fVar38 + fVar35;
            fStack_120 = -fVar39 * fVar38 + fVar34;
            fStack_11c = -fVar40 * fVar38 + fVar35;
          }
        }
        iVar15 = ((fVar44 < 0.0) - 1) + (uint)(fVar44 < 0.0);
        uVar13 = uVar1;
        if (1e-05 < fVar45) {
          fVar40 = (float)-iVar15;
          fVar44 = fVar43 + fVar40 * -fVar42;
          fVar39 = fVar42 + fVar40 * fVar43;
          in_XMM12_Db = in_XMM12_Db + fVar40 * in_XMM12_Da;
          in_XMM12_Da = in_XMM12_Da + fVar40 * fVar46;
          in_XMM6_Da = fVar44 * fVar36 + fVar35;
          in_XMM6_Db = fVar39 * fVar36 + fVar34;
          in_XMM6_Dc = in_XMM12_Db * fVar36 + fVar35;
          in_XMM6_Dd = in_XMM12_Da * fVar36 + fVar34;
          uVar13 = 3;
          if ((uVar4 & 1) != 0) {
            local_108 = fVar44 * fVar33 + fVar35;
            fStack_104 = fVar39 * fVar33 + fVar34;
            fStack_100 = in_XMM12_Db * fVar33 + fVar35;
            fStack_fc = in_XMM12_Da * fVar33 + fVar34;
            uVar13 = 6;
          }
        }
        in_XMM12_Da = -fVar42;
        bVar10 = 1e-05 < fVar45;
        bVar31 = 0 < iVar15;
        bVar30 = iVar15 < 0;
        fVar34 = in_XMM6_Dc;
        fVar35 = in_XMM6_Dd;
        if (!bVar31 || !bVar10) {
          fVar34 = fVar47;
          fVar35 = fVar48;
        }
        fVar42 = in_XMM6_Dc;
        fVar46 = in_XMM6_Dd;
        if (!bVar30 || !bVar10) {
          fVar42 = fVar32;
          fVar46 = fVar37;
        }
        pIVar22 = this->_VtxWritePtr;
        (pIVar22->pos).x = fVar35;
        (pIVar22->pos).y = fVar34;
        pIVar22->uv = IVar7;
        pIVar22 = this->_VtxWritePtr;
        pIVar22->col = col;
        pIVar22[1].pos.x = fVar46;
        pIVar22[1].pos.y = fVar42;
        pIVar22[1].uv = IVar7;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[1].col = col;
        if (1e-05 < fVar45) {
          lVar12 = (ulong)(uVar1 * 4) * 5;
          *(float *)((long)&(pIVar22->pos).x + lVar12) = in_XMM6_Db;
          *(float *)((long)&(pIVar22->pos).y + lVar12) = in_XMM6_Da;
          *(ImVec2 *)((long)&(pIVar22->uv).x + lVar12) = IVar7;
          pIVar22 = this->_VtxWritePtr;
          *(ImU32 *)((long)&pIVar22->col + lVar12) = col;
        }
        if ((uVar4 & 1) != 0) {
          fVar34 = fStack_100;
          fVar35 = fStack_fc;
          if (!bVar31 || !bVar10) {
            fVar34 = fStack_11c;
            fVar35 = fStack_120;
          }
          fVar42 = fStack_100;
          fVar46 = fStack_fc;
          if (!bVar30 || !bVar10) {
            fVar42 = fStack_124;
            fVar46 = local_128;
          }
          pIVar22[2].pos.x = fVar35;
          pIVar22[2].pos.y = fVar34;
          pIVar22[2].uv = IVar7;
          pIVar22 = this->_VtxWritePtr;
          pIVar22[2].col = uVar27;
          pIVar22[3].pos.x = fVar46;
          pIVar22[3].pos.y = fVar42;
          pIVar22[3].uv = IVar7;
          pIVar22 = this->_VtxWritePtr;
          pIVar22[3].col = uVar27;
          if (1e-05 < fVar45) {
            pIVar22[5].pos.x = fStack_104;
            pIVar22[5].pos.y = local_108;
            pIVar22[5].uv = IVar7;
            pIVar22 = this->_VtxWritePtr;
            pIVar22[5].col = uVar27;
          }
        }
        this->_VtxWritePtr = pIVar22 + uVar13;
        if (uVar17 < uVar14) {
          uVar6 = this->_VtxCurrentIdx;
          uVar11 = uVar13 + uVar6;
          if (uVar19 <= uVar17) {
            uVar11 = uVar5;
          }
          uVar25 = 0;
          if (bVar31 && bVar10) {
            uVar25 = uVar1;
          }
          uVar25 = uVar25 + uVar6;
          uVar24 = 1;
          if (bVar30 && bVar10) {
            uVar24 = uVar1;
          }
          uVar24 = uVar24 + uVar6;
          uVar26 = uVar11 + 1;
          puVar9 = this->_IdxWritePtr;
          puVar23 = puVar9 + 6;
          *puVar9 = uVar25;
          puVar9[1] = uVar24;
          puVar9[2] = uVar26;
          puVar9[3] = uVar25;
          puVar9[4] = uVar26;
          puVar9[5] = uVar11;
          this->_IdxWritePtr = puVar23;
          if (fVar45 <= 1e-05) {
            local_18c = local_18c + 3;
          }
          else {
            puVar9[6] = uVar25;
            puVar9[7] = uVar24;
            puVar9[8] = uVar6 - (~-iVar15 >> 0x1f);
            puVar23 = puVar9 + 9;
            this->_IdxWritePtr = puVar23;
          }
          if ((uVar4 & 1) != 0) {
            uVar6 = this->_VtxCurrentIdx + 2 +
                    (uint)(bVar31 && bVar10) + (uint)(bVar31 && bVar10) * 2;
            uVar2 = this->_VtxCurrentIdx + 3 + (uint)(bVar30 && bVar10) * 2;
            *puVar23 = uVar6;
            puVar23[1] = uVar25;
            puVar23[2] = uVar11;
            puVar23[3] = uVar6;
            puVar23[4] = uVar11;
            puVar23[5] = uVar11 + 2;
            puVar23[6] = uVar2;
            puVar23[7] = uVar24;
            puVar23[8] = uVar26;
            puVar23[9] = uVar2;
            puVar23[10] = uVar26;
            puVar23[0xb] = uVar11 + 3;
            this->_IdxWritePtr = puVar23 + 0xc;
            if (fVar45 <= 1e-05) {
              local_18c = local_18c + 6;
            }
            else {
              uVar6 = (uint)(iVar15 < 0);
              puVar23[0xc] = this->_VtxCurrentIdx + (2 - uVar6);
              puVar23[0xd] = uVar6 * 3 + this->_VtxCurrentIdx;
              puVar23[0xe] = this->_VtxCurrentIdx + uVar6 + 4;
              puVar23[0xf] = (2 - uVar6) + this->_VtxCurrentIdx;
              puVar23[0x10] = uVar6 + 4 + this->_VtxCurrentIdx;
              puVar23[0x11] = (uVar6 ^ 5) + this->_VtxCurrentIdx;
              this->_IdxWritePtr = puVar23 + 0x12;
            }
          }
        }
        iVar28 = (iVar28 + iVar20) - uVar13;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + uVar13;
        in_XMM12_Db = -fVar43;
        ppfVar16 = ppfVar16 + 3;
        uVar17 = uVar21;
      } while (uVar29 != uVar21);
      pIVar3 = (this->CmdBuffer).Data + (long)(this->CmdBuffer).Size + -1;
      pIVar3->ElemCount = pIVar3->ElemCount - local_18c;
      (this->VtxBuffer).Size = (this->VtxBuffer).Size - iVar28;
      (this->IdxBuffer).Size = (this->IdxBuffer).Size - local_18c;
    }
    else {
      PrimReserve(this,iVar28 * 0xc,iVar28 * 6);
      uVar19 = (int)((float)(col >> 0x18) * thickness) << 0x18 | uVar27;
      ppfVar16 = &points->y;
      uVar17 = 1;
      do {
        uVar21 = uVar17 & 0xffffffff;
        if (uVar29 == uVar17) {
          uVar21 = 0;
        }
        pfVar8 = *ppfVar16;
        fVar36 = *points[uVar21].y - *pfVar8;
        fVar33 = *points[uVar21].x - *ppfVar16[-1];
        fVar41 = fVar33 * fVar33 + fVar36 * fVar36;
        if (0.0 < fVar41) {
          fVar41 = 1.0 / SQRT(fVar41);
          fVar33 = fVar33 * fVar41;
          fVar36 = fVar36 * fVar41;
        }
        pIVar22 = this->_VtxWritePtr;
        (pIVar22->pos).x = *ppfVar16[-1] + fVar36;
        (pIVar22->pos).y = *pfVar8 - fVar33;
        pIVar22->uv = IVar7;
        pIVar22 = this->_VtxWritePtr;
        pIVar22->col = uVar27;
        pIVar22[1].pos.x = *ppfVar16[-1];
        pIVar22[1].pos.y = **ppfVar16;
        pIVar22[1].uv = IVar7;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[1].col = uVar19;
        pIVar22[2].pos.x = *ppfVar16[-1] - fVar36;
        pIVar22[2].pos.y = **ppfVar16 + fVar33;
        pIVar22[2].uv = IVar7;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[2].col = uVar27;
        pIVar22[3].pos.x = *points[uVar21].x + fVar36;
        pIVar22[3].pos.y = *points[uVar21].y - fVar33;
        pIVar22[3].uv = IVar7;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[3].col = uVar27;
        pIVar22[4].pos.x = *points[uVar21].x;
        pIVar22[4].pos.y = *points[uVar21].y;
        pIVar22[4].uv = IVar7;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[4].col = uVar19;
        pIVar22[5].pos.x = *points[uVar21].x - fVar36;
        pIVar22[5].pos.y = fVar33 + *points[uVar21].y;
        pIVar22[5].uv = IVar7;
        pIVar22 = this->_VtxWritePtr;
        pIVar22[5].col = uVar27;
        this->_VtxWritePtr = pIVar22 + 6;
        uVar4 = this->_VtxCurrentIdx;
        puVar23 = this->_IdxWritePtr;
        *puVar23 = uVar4;
        puVar23[1] = uVar4 + 1;
        puVar23[2] = this->_VtxCurrentIdx + 4;
        uVar4 = this->_VtxCurrentIdx;
        puVar23[3] = uVar4;
        puVar23[4] = uVar4 + 4;
        puVar23[5] = this->_VtxCurrentIdx + 3;
        puVar23[6] = this->_VtxCurrentIdx + 1;
        puVar23[7] = this->_VtxCurrentIdx + 2;
        puVar23[8] = this->_VtxCurrentIdx + 5;
        puVar23[9] = this->_VtxCurrentIdx + 1;
        puVar23[10] = this->_VtxCurrentIdx + 5;
        puVar23[0xb] = this->_VtxCurrentIdx + 4;
        this->_IdxWritePtr = puVar23 + 0xc;
        this->_VtxCurrentIdx = this->_VtxCurrentIdx + 6;
        ppfVar16 = ppfVar16 + 3;
        bVar30 = uVar17 != uVar14;
        uVar17 = uVar17 + 1;
      } while (bVar30);
    }
  }
  return;
}

Assistant:

void ImDrawList::AddPolyline(const Vec2* points, const int points_count, ImU32 col, bool closed, float thickness)
{
    if (points_count < 2)
        return;

    const ImVec2 uv = _Data->TexUvWhitePixel;

    int count = points_count; // segment count
    if (!closed)
        count = points_count -1 ;

    const bool antialias = Flags & ImDrawListFlags_AntiAliasedLines;
    const float AA_SIZE = 1.0f;
    const ImU32 col_trans = col & ~IM_COL32_A_MASK;

    if (antialias && thickness <= 1.0f)
    {
        // Anti-aliased stroke approximation
        const int idx_count = count*12;
        const int vtx_count = count*6;      // FIXME-OPT: Not sharing edges
        PrimReserve(idx_count, vtx_count);
        const ImU32 col_faded = (col & ~IM_COL32_A_MASK) | ((int)(((col >> IM_COL32_A_SHIFT) & 0xFF) * thickness) << IM_COL32_A_SHIFT);

        for (int i1 = 0; i1 < count; i1++)
        {
            const int i2 = (i1+1) == points_count ? 0 : i1+1;
            const Vec2& p1 = points[i1];
            const Vec2& p2 = points[i2];

            float dx = p2.x - p1.x;
            float dy = p2.y - p1.y;
            IM_NORMALIZE2F_OVER_ZERO(dx, dy);
            dx *= AA_SIZE;
            dy *= AA_SIZE;

            _VtxWritePtr[0].pos.x = p1.x + dy; _VtxWritePtr[0].pos.y = p1.y - dx; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col_trans;
            _VtxWritePtr[1].pos.x = p1.x     ; _VtxWritePtr[1].pos.y = p1.y     ; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col_faded;
            _VtxWritePtr[2].pos.x = p1.x - dy; _VtxWritePtr[2].pos.y = p1.y + dx; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;

            _VtxWritePtr[3].pos.x = p2.x + dy; _VtxWritePtr[3].pos.y = p2.y - dx; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
            _VtxWritePtr[4].pos.x = p2.x     ; _VtxWritePtr[4].pos.y = p2.y     ; _VtxWritePtr[4].uv = uv; _VtxWritePtr[4].col = col_faded;
            _VtxWritePtr[5].pos.x = p2.x - dy; _VtxWritePtr[5].pos.y = p2.y + dx; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
            _VtxWritePtr += 6;

            _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx); _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx+4); _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx+3);
            _IdxWritePtr[6] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[7] = (ImDrawIdx)(_VtxCurrentIdx+2); _IdxWritePtr[8] = (ImDrawIdx)(_VtxCurrentIdx+5);
            _IdxWritePtr[9] = (ImDrawIdx)(_VtxCurrentIdx+1); _IdxWritePtr[10] = (ImDrawIdx)(_VtxCurrentIdx+5); _IdxWritePtr[11] = (ImDrawIdx)(_VtxCurrentIdx+4);
            _IdxWritePtr += 12;
            _VtxCurrentIdx += 6;
        }
    }
    else
    {
        // Precise line with bevels on acute angles
        const int max_n_vtx = antialias ? 6 : 3;
        const int max_n_idx = 3 * (antialias ? 9 : 3);
        const int vtx_count = points_count * max_n_vtx;
        const int idx_count = count * max_n_idx;
        PrimReserve(idx_count, vtx_count);

        const float half_thickness = (antialias ? thickness - AA_SIZE : thickness) * 0.5f;
        const float half_thickness_aa = half_thickness + AA_SIZE;
        unsigned int first_vtx_ptr = _VtxCurrentIdx;
        unsigned int unused_vertices = 0;
        unsigned int unused_indices = 0;

        float sqlen1 = 0.0f;
        float dx1, dy1;
        if (closed)
        {
            dx1 = points[0].x - points[points_count-1].x;
            dy1 = points[0].y - points[points_count-1].y;
            sqlen1 = dx1 * dx1 + dy1 * dy1;
            IM_NORMALIZE2F_OVER_ZERO(dx1, dy1);
        }

        for (int i1 = 0; i1 < points_count; i1++)
        {
            const Vec2& p1 = points[i1];
            const int i2 = (i1 + 1 == points_count) ? 0 : i1 + 1;
            const Vec2& p2 = points[i2];
            float dx2 = p1.x - p2.x;
            float dy2 = p1.y - p2.y;
            float sqlen2 = dx2 * dx2 + dy2 * dy2;
            IM_NORMALIZE2F_OVER_ZERO(dx2, dy2);

            if (!closed && i1 == 0)
            {
                dx1 = -dx2;
                dy1 = -dy2;
                sqlen1 = sqlen2;
            }
            else if (!closed && i1 == points_count-1)
            {
                dx2 = -dx1;
                dy2 = -dy1;
                sqlen2 = sqlen1;
            }

            float miter_l_recip = dx1 * dy2 - dy1 * dx2;
            float mlx, mly, mrx, mry;     // Left and right miters
            float mlax, mlay, mrax, mray; // Left and right miters including anti-aliasing
            const bool bevel = (dx1 * dx2 + dy1 * dy2) > 1e-5f;
            if (ImFabs(miter_l_recip) > 1e-5f)
            {
                float miter_l = half_thickness / miter_l_recip;
                // Limit (inner) miter so it doesn't shoot away when miter is longer than adjacent line segments on acute angles
                if (bevel)
                {
                    // This is too aggressive (not exactly precise)
                    float min_sqlen = sqlen1 > sqlen2 ? sqlen2 : sqlen1;
                    float miter_sqlen = ((dx1 + dx2) * (dx1 + dx2) + (dy1 + dy2) * (dy1 + dy2)) * miter_l * miter_l;
                    if (miter_sqlen > min_sqlen)
                        miter_l *= ImSqrt(min_sqlen / miter_sqlen);
                }
                mlx = p1.x - (dx1 + dx2) * miter_l;
                mly = p1.y - (dy1 + dy2) * miter_l;
                mrx = p1.x + (dx1 + dx2) * miter_l;
                mry = p1.y + (dy1 + dy2) * miter_l;
                if (antialias)
                {
                    float miter_al = half_thickness_aa / miter_l_recip;
                    mlax = p1.x - (dx1 + dx2) * miter_al;
                    mlay = p1.y - (dy1 + dy2) * miter_al;
                    mrax = p1.x + (dx1 + dx2) * miter_al;
                    mray = p1.y + (dy1 + dy2) * miter_al;
                }
            }
            else
            {
                // Avoid degeneracy for (nearly) straight lines
                mlx = p1.x + dy1 * half_thickness;
                mly = p1.y - dx1 * half_thickness;
                mrx = p1.x - dy1 * half_thickness;
                mry = p1.y + dx1 * half_thickness;
                if (antialias)
                {
                    mlax = p1.x + dy1 * half_thickness_aa;
                    mlay = p1.y - dx1 * half_thickness_aa;
                    mrax = p1.x - dy1 * half_thickness_aa;
                    mray = p1.y + dx1 * half_thickness_aa;
                }
            }
            // The two bevel vertices if the angle is right or obtuse
            // miter_sign == 1, iff the outer (maybe bevelled) edge is on the right, -1 iff it is on the left
            int miter_sign = (miter_l_recip >= 0) - (miter_l_recip < 0);
            float b1x, b1y, b2x, b2y;     // First and second bevel point
            float b1ax, b1ay, b2ax, b2ay; // First and second bevel point including anti-aliasing
            if (bevel)
            {
                // FIXME-OPT: benchmark if doing these computations only once in AA case saves cycles
                b1x = p1.x + (dx1 - dy1 * miter_sign) * half_thickness;
                b1y = p1.y + (dy1 + dx1 * miter_sign) * half_thickness;
                b2x = p1.x + (dx2 + dy2 * miter_sign) * half_thickness;
                b2y = p1.y + (dy2 - dx2 * miter_sign) * half_thickness;
                if (antialias)
                {
                    b1ax = p1.x + (dx1 - dy1 * miter_sign) * half_thickness_aa;
                    b1ay = p1.y + (dy1 + dx1 * miter_sign) * half_thickness_aa;
                    b2ax = p1.x + (dx2 + dy2 * miter_sign) * half_thickness_aa;
                    b2ay = p1.y + (dy2 - dx2 * miter_sign) * half_thickness_aa;
                }
            }

            // Set the previous line direction so it doesn't need to be recomputed
            dx1 = -dx2;
            dy1 = -dy2;
            sqlen1 = sqlen2;

            // Now that we have all the point coordinates, put them into buffers

            // Vertices for each point are ordered in vertex buffer like this (looking in the direction of the polyline):
            // - left vertex*
            // - right vertex*
            // - left vertex AA fringe*  (if antialias)
            // - right vertex AA fringe* (if antialias)
            // - the remaining vertex (if bevel)
            // - the remaining vertex AA fringe (if bevel and antialias)
            // (*) if there is bevel, these vertices are the ones on the incoming edge.
            // Having all the vertices of the incoming edge in predictable positions is important - we reference them
            // even if we don't know relevant line properties yet

            int vertex_count = antialias ? (bevel ? 6 : 4) : (bevel ? 3 : 2); // FIXME: shorten the expression
            unsigned int bi = antialias ? 4 : 2; // Outgoing edge bevel vertex index
            const bool bevel_l = bevel && miter_sign < 0;
            const bool bevel_r = bevel && miter_sign > 0;

            _VtxWritePtr[0].pos.x = bevel_l ? b1x : mlx; _VtxWritePtr[0].pos.y = bevel_l ? b1y : mly; _VtxWritePtr[0].uv = uv; _VtxWritePtr[0].col = col;
            _VtxWritePtr[1].pos.x = bevel_r ? b1x : mrx; _VtxWritePtr[1].pos.y = bevel_r ? b1y : mry; _VtxWritePtr[1].uv = uv; _VtxWritePtr[1].col = col;
            if (bevel)
            {
                _VtxWritePtr[bi].pos.x = b2x; _VtxWritePtr[bi].pos.y = b2y; _VtxWritePtr[bi].uv = uv; _VtxWritePtr[bi].col = col;
            }

            if (antialias)
            {
                _VtxWritePtr[2].pos.x = bevel_l ? b1ax : mlax; _VtxWritePtr[2].pos.y = bevel_l ? b1ay : mlay; _VtxWritePtr[2].uv = uv; _VtxWritePtr[2].col = col_trans;
                _VtxWritePtr[3].pos.x = bevel_r ? b1ax : mrax; _VtxWritePtr[3].pos.y = bevel_r ? b1ay : mray; _VtxWritePtr[3].uv = uv; _VtxWritePtr[3].col = col_trans;
                if (bevel)
                {
                    _VtxWritePtr[5].pos.x = b2ax; _VtxWritePtr[5].pos.y = b2ay; _VtxWritePtr[5].uv = uv; _VtxWritePtr[5].col = col_trans;
                }
            }
            unused_vertices += max_n_vtx - vertex_count;
            _VtxWritePtr += vertex_count;

            if (i1 < count)
            {
                const int vtx_next_id = i1 < points_count-1 ? _VtxCurrentIdx+vertex_count : first_vtx_ptr;
                unsigned int l1i = _VtxCurrentIdx + (bevel_l ? bi : 0);
                unsigned int r1i = _VtxCurrentIdx + (bevel_r ? bi : 1);
                unsigned int l2i = vtx_next_id;
                unsigned int r2i = vtx_next_id + 1;
                unsigned int ebi = _VtxCurrentIdx + (bevel_l ? 0 : 1); // incoming edge bevel vertex index

                _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)r2i;
                _IdxWritePtr[3] = (ImDrawIdx)l1i; _IdxWritePtr[4] = (ImDrawIdx)r2i; _IdxWritePtr[5] = (ImDrawIdx)l2i;
                _IdxWritePtr += 6;

                if (bevel)
                {
                    _IdxWritePtr[0] = (ImDrawIdx)l1i; _IdxWritePtr[1] = (ImDrawIdx)r1i; _IdxWritePtr[2] = (ImDrawIdx)ebi;
                    _IdxWritePtr += 3;
                }
                else
                    unused_indices += 3;

                if (antialias)
                {
                    unsigned int l1ai = _VtxCurrentIdx + (bevel_l ? 5 : 2);
                    unsigned int r1ai = _VtxCurrentIdx + (bevel_r ? 5 : 3);
                    unsigned int l2ai = vtx_next_id + 2;
                    unsigned int r2ai = vtx_next_id + 3;

                    _IdxWritePtr[0] = (ImDrawIdx)l1ai; _IdxWritePtr[1]  = (ImDrawIdx)l1i; _IdxWritePtr[2]  = (ImDrawIdx)l2i;
                    _IdxWritePtr[3] = (ImDrawIdx)l1ai; _IdxWritePtr[4]  = (ImDrawIdx)l2i; _IdxWritePtr[5]  = (ImDrawIdx)l2ai;
                    _IdxWritePtr[6] = (ImDrawIdx)r1ai; _IdxWritePtr[7]  = (ImDrawIdx)r1i; _IdxWritePtr[8]  = (ImDrawIdx)r2i;
                    _IdxWritePtr[9] = (ImDrawIdx)r1ai; _IdxWritePtr[10] = (ImDrawIdx)r2i; _IdxWritePtr[11] = (ImDrawIdx)r2ai;
                    _IdxWritePtr += 12;

                    if (bevel)
                    {
                        _IdxWritePtr[0] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[1] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 3 : 0));
                        _IdxWritePtr[2] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));

                        _IdxWritePtr[3] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 1 : 2));
                        _IdxWritePtr[4] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 5 : 4));
                        _IdxWritePtr[5] = (ImDrawIdx)(_VtxCurrentIdx + (bevel_r ? 4 : 5));
                        _IdxWritePtr += 6;
                    }
                    else
                    {
                        unused_indices += 6;
                    }
                }
            }
            _VtxCurrentIdx += vertex_count;
        }
        PrimUnreserve((int)unused_indices, (int)unused_vertices);
    }
}